

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)

{
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var2;
  int iVar3;
  bnode *__ptr;
  bnode *__ptr_00;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0;
  __ptr->flag = 0;
  __ptr->level = 0;
  __ptr->nentry = 0;
  (__ptr->field_4).data = (void *)0x0;
  __ptr->kvsize = 0x801;
  __ptr->level = 1;
  __ptr->nentry = 10;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 'd';
  uVar7 = 0;
  pcVar5 = (char *)(auStack_c0 + 3);
  do {
    pcVar4 = pcVar5;
    pcVar5 = pcVar4 + -0x10;
    auStack_c0[uVar7 + 3] = pcVar5;
    builtin_strncpy(pcVar4 + -0x18,"r;\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    sprintf(pcVar5,"key%d",uVar7 & 0xffffffff);
    p_Var1 = kv_ops->set_kv;
    pcVar4[-0x18] = -0x7d;
    pcVar4[-0x17] = ';';
    pcVar4[-0x16] = '\x10';
    pcVar4[-0x15] = '\0';
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)uVar7,pcVar5,local_31);
    local_31[0] = local_31[0] + '\x01';
    uVar7 = uVar7 + 1;
  } while (uVar7 != 10);
  pcVar4[-0x18] = -0x67;
  pcVar4[-0x17] = ';';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  __ptr_00 = (bnode *)malloc(0x1010);
  __ptr_00->kvsize = 0;
  __ptr_00->flag = 0;
  __ptr_00->level = 0;
  __ptr_00->nentry = 0;
  (__ptr_00->field_4).data = (void *)0x0;
  __ptr_00->kvsize = 0x801;
  __ptr_00->level = 1;
  (__ptr_00->field_4).data = __ptr_00 + 1;
  lVar6 = 0;
  p_Var2 = kv_ops->copy_kv;
  pcVar4[-0x18] = -0x31;
  pcVar4[-0x17] = ';';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,0,5,5);
  local_31[0] = 'i';
  do {
    p_Var1 = kv_ops->get_kv;
    pcVar4[-0x18] = -0x16;
    pcVar4[-0x17] = ';';
    pcVar4[-0x16] = '\x10';
    pcVar4[-0x15] = '\0';
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(idx_t)lVar6,&__test_begin.tv_usec,&local_32);
    pcVar5 = (char *)auStack_c0[lVar6 + 8];
    pcVar4[-0x18] = -6;
    pcVar4[-0x17] = ';';
    pcVar4[-0x16] = '\x10';
    pcVar4[-0x15] = '\0';
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    iVar3 = strcmp((char *)&__test_begin.tv_usec,pcVar5);
    if (iVar3 != 0) {
      builtin_strncpy(pcVar4 + -0x18,"\x1f<\x10",4);
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar4 + -0x18,".<\x10",4);
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    local_31[0] = local_31[0] + '\x01';
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  lVar6 = 0;
  p_Var2 = kv_ops->copy_kv;
  builtin_strncpy(pcVar4 + -0x18,"J<\x10",4);
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,5,0,10);
  local_31[0] = 'd';
  do {
    p_Var1 = kv_ops->get_kv;
    builtin_strncpy(pcVar4 + -0x18,"i<\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(short)lVar6 + 5,&__test_begin.tv_usec,&local_32);
    pcVar5 = (char *)auStack_c0[lVar6 + 3];
    builtin_strncpy(pcVar4 + -0x18,"|<\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    iVar3 = strcmp((char *)&__test_begin.tv_usec,pcVar5);
    if (iVar3 != 0) {
      pcVar4[-0x18] = -0x5f;
      pcVar4[-0x17] = '<';
      pcVar4[-0x16] = '\x10';
      pcVar4[-0x15] = '\0';
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    if (local_32 != local_31[0]) {
      pcVar4[-0x18] = -0x50;
      pcVar4[-0x17] = '<';
      pcVar4[-0x16] = '\x10';
      pcVar4[-0x15] = '\0';
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    local_31[0] = local_31[0] + '\x01';
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  lVar6 = 0;
  p_Var2 = kv_ops->copy_kv;
  pcVar4[-0x18] = -0x37;
  pcVar4[-0x17] = '<';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,0,0,10);
  local_31[0] = 'd';
  do {
    p_Var1 = kv_ops->get_kv;
    pcVar4[-0x18] = -0x1c;
    pcVar4[-0x17] = '<';
    pcVar4[-0x16] = '\x10';
    pcVar4[-0x15] = '\0';
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(idx_t)lVar6,&__test_begin.tv_usec,&local_32);
    pcVar5 = (char *)auStack_c0[lVar6 + 3];
    pcVar4[-0x18] = -9;
    pcVar4[-0x17] = '<';
    pcVar4[-0x16] = '\x10';
    pcVar4[-0x15] = '\0';
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    iVar3 = strcmp((char *)&__test_begin.tv_usec,pcVar5);
    if (iVar3 != 0) {
      builtin_strncpy(pcVar4 + -0x18,"\x1c=\x10",4);
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar4 + -0x18,"+=\x10",4);
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    local_31[0] = local_31[0] + '\x01';
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  builtin_strncpy(pcVar4 + -0x18,"6=\x10",4);
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  free(__ptr);
  builtin_strncpy(pcVar4 + -0x18,">=\x10",4);
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  free(__ptr_00);
  builtin_strncpy(pcVar4 + -0x18,"C=\x10",4);
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  memleak_end();
  pcVar5 = "%s PASSED\n";
  if (kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar5 = "%s FAILED\n";
  }
  builtin_strncpy(pcVar4 + -0x18,"t=\x10",4);
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  fprintf(_stderr,pcVar5,"kv_copy_var_nentry_test");
  return;
}

Assistant:

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node, node_dst;
    uint8_t v, v_out;
    idx_t idx, src_idx, dst_idx, len;
    int n=10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    // set n items into source node
    for (idx = 0; idx < n; idx++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // copy n/2 entries into dest node
    src_idx = n/2;
    dst_idx = 0;
    len = src_idx;
    node_dst = dummy_node(ksize, vsize, 1);
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, len);

    // verify
    v = 100 + n/2;
    for (idx = 0; idx < n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx + n/2])));
        TEST_CHK(v_out == v);
        v++;

    }

    // append n entries into dst node
    dst_idx = src_idx;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = n/2; idx < n+n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx - n/2])));
        TEST_CHK(v_out == v);
        v++;
    }

    // prepend n entries into dst node
    dst_idx = 0;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = src_idx; idx < n; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node); free(node_dst);

    memleak_end();
    TEST_RESULT("kv_copy_var_nentry_test");
}